

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O2

char * Mio_LibDeriveSop(int nVars,Vec_Int_t *vExpr,Vec_Str_t *vStr)

{
  Vec_Ptr_t *p;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *pVVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  void *pvVar9;
  Vec_Ptr_t *p_01;
  char *pStr;
  int iVar10;
  Vec_Ptr_t *p_02;
  Vec_Ptr_t *pVVar11;
  
  vStr->nSize = 0;
  iVar1 = Vec_IntEntry(vExpr,0);
  if (iVar1 == -1) {
    pStr = " 0\n";
  }
  else {
    iVar1 = Vec_IntEntry(vExpr,0);
    if (iVar1 != -2) {
      if ((vExpr->nSize == 1) && (iVar1 = Vec_IntEntry(vExpr,0), iVar1 != -1)) {
        iVar1 = Vec_IntEntry(vExpr,0);
        if (iVar1 != -2) {
          iVar1 = 0;
          if (0 < nVars) {
            iVar1 = nVars;
          }
          while (iVar1 != 0) {
            Vec_StrPush(vStr,'-');
            iVar1 = iVar1 + -1;
          }
          Vec_StrPrintStr(vStr," 1\n");
          Vec_StrPush(vStr,'\0');
          iVar1 = Vec_IntEntry(vExpr,0);
          if (nVars <= iVar1 >> 1) {
            __assert_fail("(Vec_IntEntry(vExpr,0) >> 1) < nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioSop.c"
                          ,0x119,"char *Mio_LibDeriveSop(int, Vec_Int_t *, Vec_Str_t *)");
          }
          iVar1 = Vec_IntEntry(vExpr,0);
          uVar4 = iVar1 >> 1;
          iVar1 = Vec_IntEntry(vExpr,0);
          if (((int)uVar4 < 0) || (vStr->nSize <= (int)uVar4)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                          ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
          }
          vStr->pArray[uVar4] = (byte)iVar1 & 1 ^ 0x31;
          goto LAB_006ef61d;
        }
      }
      p_00 = Vec_PtrAlloc(vExpr->nSize / 2 + nVars);
      pVVar6 = Vec_PtrAlloc(vExpr->nSize / 2 + nVars);
      iVar1 = 0;
      iVar10 = 0;
      if (0 < nVars) {
        iVar1 = 0;
        iVar10 = nVars;
      }
      for (; iVar10 != iVar1; iVar1 = iVar1 + 1) {
        pVVar7 = Mio_SopVar0(iVar1);
        Vec_PtrPush(p_00,pVVar7);
        pVVar7 = Mio_SopVar1(iVar1);
        Vec_PtrPush(pVVar6,pVVar7);
      }
      iVar10 = 0;
      iVar1 = 1;
      while( true ) {
        uVar4 = vExpr->nSize;
        if ((int)uVar4 / 2 <= iVar10) break;
        iVar2 = Vec_IntEntry(vExpr,iVar1 + -1);
        iVar3 = Vec_IntEntry(vExpr,iVar1);
        uVar4 = Vec_IntEntry(vExpr,iVar1 + -1);
        uVar5 = Vec_IntEntry(vExpr,iVar1);
        p_01 = pVVar6;
        pVVar11 = p_00;
        if ((uVar5 & 1) == 0) {
          p_01 = p_00;
          pVVar11 = pVVar6;
        }
        p_02 = pVVar6;
        p = p_00;
        if ((uVar4 & 1) == 0) {
          p_02 = p_00;
          p = pVVar6;
        }
        pVVar7 = (Vec_Int_t *)Vec_PtrEntry(p,iVar2 >> 1);
        pVVar8 = (Vec_Int_t *)Vec_PtrEntry(pVVar11,iVar3 >> 1);
        pVVar7 = Mio_SopCoverAnd(pVVar7,pVVar8);
        Vec_PtrPush(pVVar6,pVVar7);
        pVVar7 = (Vec_Int_t *)Vec_PtrEntry(p_02,iVar2 >> 1);
        pVVar8 = (Vec_Int_t *)Vec_PtrEntry(p_01,iVar3 >> 1);
        pVVar7 = Mio_SopCoverOr(pVVar7,pVVar8);
        Vec_PtrPush(p_00,pVVar7);
        iVar10 = iVar10 + 1;
        iVar1 = iVar1 + 2;
      }
      if ((int)uVar4 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
      }
      pVVar11 = pVVar6;
      if ((*(byte *)(vExpr->pArray + ((ulong)uVar4 - 1)) & 1) == 0) {
        pVVar11 = p_00;
        p_00 = pVVar6;
      }
      pvVar9 = Vec_PtrEntryLast(pVVar11);
      iVar1 = *(int *)((long)pvVar9 + 4);
      pvVar9 = Vec_PtrEntryLast(p_00);
      pVVar6 = p_00;
      if (iVar1 < *(int *)((long)pvVar9 + 4)) {
        pVVar6 = pVVar11;
      }
      pVVar7 = (Vec_Int_t *)Vec_PtrEntryLast(pVVar6);
      pVVar8 = (Vec_Int_t *)Vec_PtrEntryLast(p_00);
      Mio_SopDeriveFromArray(pVVar7,nVars,vStr,(uint)(pVVar7 == pVVar8));
      Vec_VecFree((Vec_Vec_t *)pVVar11);
      Vec_VecFree((Vec_Vec_t *)p_00);
      goto LAB_006ef61d;
    }
    pStr = " 1\n";
  }
  Vec_StrPrintStr(vStr,pStr);
  Vec_StrPush(vStr,'\0');
LAB_006ef61d:
  return vStr->pArray;
}

Assistant:

char * Mio_LibDeriveSop( int nVars, Vec_Int_t * vExpr, Vec_Str_t * vStr )
{
    Vec_Int_t * vSop;
    Vec_Ptr_t * vSops0, * vSops1, * vTemp;
    int i, Index0, Index1, fCompl0, fCompl1;
    Vec_StrClear( vStr );
    if ( Exp_IsConst0(vExpr) )
    {
        Vec_StrPrintStr( vStr, " 0\n" );
        Vec_StrPush( vStr, '\0' );
        return Vec_StrArray( vStr );
    }
    if ( Exp_IsConst1(vExpr) )
    {
        Vec_StrPrintStr( vStr, " 1\n" );
        Vec_StrPush( vStr, '\0' );
        return Vec_StrArray( vStr );
    }
    if ( Exp_IsLit(vExpr) )
    {
        for ( i = 0; i < nVars; i++ )
            Vec_StrPush( vStr, '-' );
        Vec_StrPrintStr( vStr, " 1\n" );
        Vec_StrPush( vStr, '\0' );
        assert( (Vec_IntEntry(vExpr,0) >> 1) < nVars );
        Vec_StrWriteEntry( vStr, Vec_IntEntry(vExpr,0) >> 1, (char)('1' - (Vec_IntEntry(vExpr,0) & 1)) );
        return Vec_StrArray( vStr );
    }
    vSops0 = Vec_PtrAlloc( nVars + Exp_NodeNum(vExpr) );
    vSops1 = Vec_PtrAlloc( nVars + Exp_NodeNum(vExpr) );
    for ( i = 0; i < nVars; i++ )
    {
        Vec_PtrPush( vSops0, Mio_SopVar0(i) );
        Vec_PtrPush( vSops1, Mio_SopVar1(i) );
    }
    for ( i = 0; i < Exp_NodeNum(vExpr); i++ )
    {
        Index0  = Vec_IntEntry( vExpr, 2*i+0 ) >> 1;
        Index1  = Vec_IntEntry( vExpr, 2*i+1 ) >> 1;
        fCompl0 = Vec_IntEntry( vExpr, 2*i+0 ) & 1;
        fCompl1 = Vec_IntEntry( vExpr, 2*i+1 ) & 1;
        // positive polarity
        vSop = Mio_SopCoverAnd( fCompl0 ? (Vec_Int_t *)Vec_PtrEntry(vSops0, Index0) : (Vec_Int_t *)Vec_PtrEntry(vSops1, Index0),
                                fCompl1 ? (Vec_Int_t *)Vec_PtrEntry(vSops0, Index1) : (Vec_Int_t *)Vec_PtrEntry(vSops1, Index1) );
        Vec_PtrPush( vSops1, vSop );
        // negative polarity
        vSop = Mio_SopCoverOr( fCompl0 ? (Vec_Int_t *)Vec_PtrEntry(vSops1, Index0) : (Vec_Int_t *)Vec_PtrEntry(vSops0, Index0),
                               fCompl1 ? (Vec_Int_t *)Vec_PtrEntry(vSops1, Index1) : (Vec_Int_t *)Vec_PtrEntry(vSops0, Index1) );
        Vec_PtrPush( vSops0, vSop );
    }
    // complement
    if ( Vec_IntEntryLast(vExpr) & 1 )
    {
        vTemp  = vSops0;
        vSops0 = vSops1;
        vSops1 = vTemp;
    }
    // select the best polarity
    if ( Vec_IntSize( (Vec_Int_t *)Vec_PtrEntryLast(vSops0) ) < Vec_IntSize( (Vec_Int_t *)Vec_PtrEntryLast(vSops1) ) )
        vSop = (Vec_Int_t *)Vec_PtrEntryLast(vSops0);
    else
        vSop = (Vec_Int_t *)Vec_PtrEntryLast(vSops1);
    // convert positive polarity into SOP
    Mio_SopDeriveFromArray( vSop, nVars, vStr, (vSop == Vec_PtrEntryLast(vSops1)) );
    Vec_VecFree( (Vec_Vec_t *)vSops0 );
    Vec_VecFree( (Vec_Vec_t *)vSops1 );
    return Vec_StrArray( vStr );
}